

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O1

void cl_send_cb(uv_udp_send_t *req,int status)

{
  int iVar1;
  uv_udp_t *puVar2;
  code **ppcVar3;
  int64_t eval_b;
  int64_t eval_a;
  code *apcStack_20 [2];
  undefined8 local_10;
  void *local_8;
  
  if (req == (uv_udp_send_t *)0x0) {
    apcStack_20[0] = (code *)0x1e185b;
    cl_send_cb_cold_3();
  }
  else {
    local_8 = (void *)(long)status;
    local_10 = 0;
    if (local_8 == (void *)0x0) {
      local_8 = (void *)(ulong)(req->handle == &client || req->handle == &server);
      local_10 = 0;
      if (local_8 != (void *)0x0) {
        cl_send_cb_called = cl_send_cb_called + 1;
        return;
      }
      goto LAB_001e186a;
    }
  }
  apcStack_20[0] = (code *)0x1e186a;
  cl_send_cb_cold_1();
LAB_001e186a:
  puVar2 = (uv_udp_t *)&stack0xfffffffffffffff8;
  apcStack_20[0] = close_cb;
  cl_send_cb_cold_2();
  apcStack_20[0] = (code *)(ulong)(puVar2 == &client || puVar2 == &server);
  if (apcStack_20[0] == (code *)0x0) {
    close_cb_cold_2();
  }
  else {
    apcStack_20[0] = (code *)0x1;
    iVar1 = uv_is_closing();
    if (apcStack_20[0] == (code *)(long)iVar1) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  ppcVar3 = apcStack_20;
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(ppcVar3,0);
  return;
}

Assistant:

static void cl_send_cb(uv_udp_send_t* req, int status) {
  int r;

  ASSERT_NOT_NULL(req);
  ASSERT_OK(status);
  CHECK_HANDLE(req->handle);

  r = uv_udp_recv_start(req->handle, cl_alloc_cb, cl_recv_cb);
  ASSERT_OK(r);

  cl_send_cb_called++;
}